

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O1

int fp_help(void)

{
  fp_msg("fpack, a FITS image compression program.  Version ");
  fp_version();
  fp_usage();
  fp_msg("\n");
  fp_msg("NOTE: the compression parameters specified on the fpack command line may\n");
  fp_msg("be over-ridden by compression directive keywords in the header of each HDU\n");
  fp_msg("of the input file(s). See the fpack User\'s Guide for more details\n");
  fp_msg("\n");
  fp_msg("Flags must be separate and appear before filenames:\n");
  fp_msg(" -r          Rice compression [default], or\n");
  fp_msg(" -h          Hcompress compression, or\n");
  fp_msg(" -g  or -g1  GZIP_1 (per-tile) compression, or\n");
  fp_msg(" -g2         GZIP_2 (per-tile) compression (with byte shuffling), or\n");
  fp_msg(" -p          PLIO compression (only for positive 8 or 16-bit integer images).\n");
  fp_msg(" -d          Tile the image without compression (debugging mode).\n");
  fp_msg(" -w          Compress the whole image as a single large tile.\n");
  fp_msg(" -t <axes>   Comma separated list of tile dimensions [default is row by row].\n");
  fp_msg(" -q <level>  Quantized level spacing when converting floating point images to\n");
  fp_msg("             scaled integers. (+value relative to sigma of background noise;\n");
  fp_msg("             -value is absolute). Default q value of 4 gives a compression ratio\n");
  fp_msg("             of about 6 with very high fidelity (only 0.26% increase in noise).\n");
  fp_msg("             Using q values of  2, or 1 will give compression ratios of\n");
  fp_msg("             about 8, or 10, respectively (with 1.0% or 4.1% noise increase).\n");
  fp_msg("             The scaled quantized values are randomly dithered using a seed \n");
  fp_msg("             value determined from the system clock at run time.\n");
  fp_msg("             Use -q0 instead of -q to suppress random dithering.\n");
  fp_msg("             Use -qz instead of -q to not dither zero-valued pixels.\n");
  fp_msg("             Use -qt or -qzt to compute random dithering seed from first tile checksum.\n"
        );
  fp_msg("             Use -qN or -qzN, (N in range 1 to 10000) to use a specific dithering seed.\n"
        );
  fp_msg("             Floating-point images can be losslessly compressed by selecting\n");
  fp_msg("             the GZIP algorithm and specifying -q 0, but this is slower and often\n");
  fp_msg("             produces much less compression than the default quantization method.\n");
  fp_msg(" -i2f        Convert integer images to floating point, then quantize and compress\n");
  fp_msg("             using the specified q level.  When used appropriately, this lossy\n");
  fp_msg("             compression method can give much better compression than the normal\n");
  fp_msg("             lossless compression methods without significant loss of information.\n");
  fp_msg("             The -n3ratio and -n3min flags control the minimum noise thresholds;\n");
  fp_msg("             Images below these thresholds will be losslessly compressed.\n");
  fp_msg(" -n3ratio    Minimum ratio of background noise sigma divided by q.  Default = 2.0.\n");
  fp_msg(" -n3min      Minimum background noise sigma. Default = 6. The -i2f flag will be ignored\n"
        );
  fp_msg("             if the noise level in the image does not exceed both thresholds.\n");
  fp_msg(" -s <scale>  Scale factor for lossy Hcompress [default = 0 = lossless]\n");
  fp_msg("             (+values relative to RMS noise; -value is absolute)\n");
  fp_msg(" -n <noise>  Rescale scaled-integer images to reduce noise and improve compression.\n");
  fp_msg(" -v          Verbose mode; list each file as it is processed.\n");
  fp_msg(" -T          Show compression algorithm comparison test statistics; files unchanged.\n");
  fp_msg(" -R <file>   Write the comparison test report (above) to a text file.\n");
  fp_msg(" -table      Compress FITS binary tables as well as compress any image HDUs.\n");
  fp_msg(" -tableonly  Compress only FITS binary tables; do not compress any image HDUs.\n");
  fp_msg("             \n");
  fp_msg("\nkeywords shared with funpack:\n");
  fp_msg(" -F          Overwrite input file by output file with same name.\n");
  fp_msg(" -D          Delete input file after writing output.\n");
  fp_msg(" -Y          Suppress prompts to confirm -F or -D options.\n");
  fp_msg(" -O <file>   Specify full output file name. This may be used only when fpack\n");
  fp_msg("               is run on a single input file.\n");
  fp_msg(" -S          Output compressed FITS files to STDOUT.\n");
  fp_msg(" -L          List contents; files unchanged.\n");
  fp_msg(" -C          Don\'t update FITS checksum keywords.\n");
  fp_msg(" -H          Show this message.\n");
  fp_msg(" -V          Show version number.\n");
  fp_msg(
        "\n <FITS>      FITS files to pack; enter \'-\' (a hyphen) to read input from stdin stream.\n"
        );
  fp_msg(" Refer to the fpack User\'s Guide for more extensive help.\n");
  return 0;
}

Assistant:

int fp_help (void)
{
fp_msg ("fpack, a FITS image compression program.  Version ");
fp_version ();
fp_usage ();
fp_msg ("\n");
fp_msg ("NOTE: the compression parameters specified on the fpack command line may\n");
fp_msg ("be over-ridden by compression directive keywords in the header of each HDU\n");
fp_msg ("of the input file(s). See the fpack User's Guide for more details\n");
fp_msg ("\n");

fp_msg ("Flags must be separate and appear before filenames:\n");
fp_msg (" -r          Rice compression [default], or\n");
fp_msg (" -h          Hcompress compression, or\n");
fp_msg (" -g  or -g1  GZIP_1 (per-tile) compression, or\n");
fp_msg (" -g2         GZIP_2 (per-tile) compression (with byte shuffling), or\n");
/*
fp_msg (" -b          BZIP2 (per-tile) compression, or\n");
*/
fp_msg (" -p          PLIO compression (only for positive 8 or 16-bit integer images).\n");
fp_msg (" -d          Tile the image without compression (debugging mode).\n");

fp_msg (" -w          Compress the whole image as a single large tile.\n");
fp_msg (" -t <axes>   Comma separated list of tile dimensions [default is row by row].\n");

fp_msg (" -q <level>  Quantized level spacing when converting floating point images to\n");
fp_msg ("             scaled integers. (+value relative to sigma of background noise;\n");
fp_msg ("             -value is absolute). Default q value of 4 gives a compression ratio\n");
fp_msg ("             of about 6 with very high fidelity (only 0.26% increase in noise).\n");
fp_msg ("             Using q values of  2, or 1 will give compression ratios of\n");
fp_msg ("             about 8, or 10, respectively (with 1.0% or 4.1% noise increase).\n");
fp_msg ("             The scaled quantized values are randomly dithered using a seed \n");
fp_msg ("             value determined from the system clock at run time.\n");
fp_msg ("             Use -q0 instead of -q to suppress random dithering.\n");
fp_msg ("             Use -qz instead of -q to not dither zero-valued pixels.\n");
fp_msg ("             Use -qt or -qzt to compute random dithering seed from first tile checksum.\n");
fp_msg ("             Use -qN or -qzN, (N in range 1 to 10000) to use a specific dithering seed.\n");
fp_msg ("             Floating-point images can be losslessly compressed by selecting\n");
fp_msg ("             the GZIP algorithm and specifying -q 0, but this is slower and often\n");
fp_msg ("             produces much less compression than the default quantization method.\n");
fp_msg (" -i2f        Convert integer images to floating point, then quantize and compress\n");
fp_msg ("             using the specified q level.  When used appropriately, this lossy\n");
fp_msg ("             compression method can give much better compression than the normal\n");
fp_msg ("             lossless compression methods without significant loss of information.\n");
fp_msg ("             The -n3ratio and -n3min flags control the minimum noise thresholds;\n");
fp_msg ("             Images below these thresholds will be losslessly compressed.\n");
fp_msg (" -n3ratio    Minimum ratio of background noise sigma divided by q.  Default = 2.0.\n");
fp_msg (" -n3min      Minimum background noise sigma. Default = 6. The -i2f flag will be ignored\n");
fp_msg ("             if the noise level in the image does not exceed both thresholds.\n");
fp_msg (" -s <scale>  Scale factor for lossy Hcompress [default = 0 = lossless]\n");
fp_msg ("             (+values relative to RMS noise; -value is absolute)\n");
fp_msg (" -n <noise>  Rescale scaled-integer images to reduce noise and improve compression.\n");
fp_msg (" -v          Verbose mode; list each file as it is processed.\n");
fp_msg (" -T          Show compression algorithm comparison test statistics; files unchanged.\n");
fp_msg (" -R <file>   Write the comparison test report (above) to a text file.\n");
fp_msg (" -table      Compress FITS binary tables as well as compress any image HDUs.\n");
fp_msg (" -tableonly  Compress only FITS binary tables; do not compress any image HDUs.\n");
fp_msg ("             \n");

fp_msg ("\nkeywords shared with funpack:\n");

fp_msg (" -F          Overwrite input file by output file with same name.\n");
fp_msg (" -D          Delete input file after writing output.\n");
fp_msg (" -Y          Suppress prompts to confirm -F or -D options.\n");

fp_msg (" -O <file>   Specify full output file name. This may be used only when fpack\n");
fp_msg ("               is run on a single input file.\n");
fp_msg (" -S          Output compressed FITS files to STDOUT.\n");
fp_msg (" -L          List contents; files unchanged.\n");

fp_msg (" -C          Don't update FITS checksum keywords.\n");

fp_msg (" -H          Show this message.\n");
fp_msg (" -V          Show version number.\n");

fp_msg ("\n <FITS>      FITS files to pack; enter '-' (a hyphen) to read input from stdin stream.\n");
fp_msg (" Refer to the fpack User's Guide for more extensive help.\n");
return(0);
}